

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void duckdb_brotli::BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,BrotliEncoderParams *params,
               ContextType literal_context_mode,Command *commands,size_t n_commands,
               MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  BlockEncoder *self;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  HuffmanTree *tree;
  BlockEncoder *self_00;
  BlockEncoder *self_01;
  ulong uVar8;
  uint8_t *puVar9;
  uint16_t *puVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  size_t context;
  HistogramLiteral *histogram;
  size_t i;
  EncodeContextMapArena *arena;
  uint uVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  uint uVar18;
  size_t sVar19;
  HistogramCommand *histogram_00;
  HistogramDistance *histogram_01;
  bool bVar20;
  
  uVar7 = (params->dist).alphabet_size_max;
  uVar18 = (params->dist).alphabet_size_limit;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  self_00 = (BlockEncoder *)BrotliAllocate(m,0x1298);
  self_01 = self_00 + 1;
  self = self_00 + 2;
  InitBlockEncoder(self_00,0x100,(mb->literal_split).num_types,(mb->literal_split).types,
                   (mb->literal_split).lengths,(mb->literal_split).num_blocks);
  InitBlockEncoder(self_01,0x2c0,(mb->command_split).num_types,(mb->command_split).types,
                   (mb->command_split).lengths,(mb->command_split).num_blocks);
  InitBlockEncoder(self,(ulong)uVar18,(mb->distance_split).num_types,(mb->distance_split).types,
                   (mb->distance_split).lengths,(mb->distance_split).num_blocks);
  BuildAndStoreBlockSwitchEntropyCodes(self_00,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(self_01,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(self,tree,storage_ix,storage);
  uVar13 = *storage_ix;
  *(ulong *)(storage + (uVar13 >> 3)) =
       (ulong)(params->dist).distance_postfix_bits << ((byte)uVar13 & 7) |
       (ulong)storage[uVar13 >> 3];
  uVar8 = uVar13 + 2;
  *storage_ix = uVar8;
  *(ulong *)(storage + (uVar8 >> 3)) =
       (ulong)((params->dist).num_direct_distance_codes >>
              ((byte)(params->dist).distance_postfix_bits & 0x1f)) << ((byte)uVar8 & 7) |
       (ulong)storage[uVar8 >> 3];
  uVar13 = uVar13 + 6;
  *storage_ix = uVar13;
  for (uVar8 = 0; uVar8 < (mb->literal_split).num_types; uVar8 = uVar8 + 1) {
    *(ulong *)(storage + (uVar13 >> 3)) =
         (ulong)literal_context_mode << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
    uVar13 = uVar13 + 2;
    *storage_ix = uVar13;
  }
  arena = (EncodeContextMapArena *)(self_00 + 3);
  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(arena,mb->literal_histograms_size,6,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,arena,mb->literal_context_map,mb->literal_context_map_size,
                     mb->literal_histograms_size,tree,storage_ix,storage);
  }
  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(arena,mb->distance_histograms_size,2,tree,storage_ix,storage);
  }
  else {
    EncodeContextMap(m,arena,mb->distance_context_map,mb->distance_context_map_size,
                     mb->distance_histograms_size,tree,storage_ix,storage);
  }
  histogram = mb->literal_histograms;
  sVar16 = mb->literal_histograms_size;
  sVar19 = self_00->histogram_length_ * sVar16;
  if (sVar19 == 0) {
    self_00->depths_ = (uint8_t *)0x0;
    puVar10 = (uint16_t *)0x0;
  }
  else {
    puVar9 = (uint8_t *)BrotliAllocate(m,sVar19);
    self_00->depths_ = puVar9;
    puVar10 = (uint16_t *)BrotliAllocate(m,sVar19 * 2);
  }
  self_00->bits_ = puVar10;
  for (sVar19 = 0; sVar16 != sVar19; sVar19 = sVar19 + 1) {
    lVar17 = self_00->histogram_length_ * sVar19;
    BuildAndStoreHuffmanTree
              (histogram->data_,self_00->histogram_length_,0x100,tree,self_00->depths_ + lVar17,
               self_00->bits_ + lVar17,storage_ix,storage);
    histogram = histogram + 1;
  }
  histogram_00 = mb->command_histograms;
  sVar16 = mb->command_histograms_size;
  sVar19 = self_01->histogram_length_ * sVar16;
  if (sVar19 == 0) {
    self_00[1].depths_ = (uint8_t *)0x0;
    puVar10 = (uint16_t *)0x0;
  }
  else {
    puVar9 = (uint8_t *)BrotliAllocate(m,sVar19);
    self_00[1].depths_ = puVar9;
    puVar10 = (uint16_t *)BrotliAllocate(m,sVar19 * 2);
  }
  self_00[1].bits_ = puVar10;
  for (sVar19 = 0; sVar16 != sVar19; sVar19 = sVar19 + 1) {
    lVar17 = self_00[1].histogram_length_ * sVar19;
    BuildAndStoreHuffmanTree
              (histogram_00->data_,self_00[1].histogram_length_,0x2c0,tree,
               self_00[1].depths_ + lVar17,self_00[1].bits_ + lVar17,storage_ix,storage);
    histogram_00 = histogram_00 + 1;
  }
  histogram_01 = mb->distance_histograms;
  sVar16 = mb->distance_histograms_size;
  sVar19 = self->histogram_length_ * sVar16;
  if (sVar19 == 0) {
    self_00[2].depths_ = (uint8_t *)0x0;
    puVar10 = (uint16_t *)0x0;
  }
  else {
    puVar9 = (uint8_t *)BrotliAllocate(m,sVar19);
    self_00[2].depths_ = puVar9;
    puVar10 = (uint16_t *)BrotliAllocate(m,sVar19 * 2);
  }
  self_00[2].bits_ = puVar10;
  for (sVar19 = 0; sVar16 != sVar19; sVar19 = sVar19 + 1) {
    lVar17 = self_00[2].histogram_length_ * sVar19;
    BuildAndStoreHuffmanTree
              (histogram_01->data_,self_00[2].histogram_length_,(ulong)uVar7,tree,
               self_00[2].depths_ + lVar17,self_00[2].bits_ + lVar17,storage_ix,storage);
    histogram_01 = histogram_01 + 1;
  }
  BrotliFree(m,tree);
  for (sVar16 = 0; sVar16 != n_commands; sVar16 = sVar16 + 1) {
    uVar7 = commands[sVar16].insert_len_;
    uVar8 = (ulong)uVar7;
    uVar18 = commands[sVar16].copy_len_;
    uVar4 = commands[sVar16].dist_extra_;
    uVar2 = commands[sVar16].cmd_prefix_;
    uVar3 = commands[sVar16].dist_prefix_;
    StoreSymbol(self_01,(ulong)uVar2,storage_ix,storage);
    uVar14 = uVar7;
    if (5 < uVar8) {
      if (uVar7 < 0x82) {
        uVar14 = 0x1f;
        uVar12 = (uint)(uVar8 - 2);
        if (uVar12 != 0) {
          for (; uVar12 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        iVar11 = (uVar14 ^ 0xffffffe0) + 0x1f;
        uVar14 = (int)(uVar8 - 2 >> ((byte)iVar11 & 0x3f)) + iVar11 * 2 + 2;
      }
      else if (uVar7 < 0x842) {
        uVar14 = 0x1f;
        if (uVar7 - 0x42 != 0) {
          for (; uVar7 - 0x42 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar14 = (uVar14 ^ 0xffffffe0) + 0x2a;
      }
      else {
        uVar14 = 0x15;
        if (0x1841 < uVar7) {
          uVar14 = 0x17 - (uVar7 < 0x5842);
        }
      }
    }
    bVar1 = (byte)(uVar18 >> 0x18);
    uVar18 = uVar18 & 0x1ffffff;
    uVar12 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + uVar18;
    if (uVar12 < 10) {
      uVar15 = uVar12 + 0xfffe;
    }
    else if (uVar12 < 0x86) {
      uVar15 = 0x1f;
      uVar6 = (uint)((ulong)uVar12 - 6);
      if (uVar6 != 0) {
        for (; uVar6 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      iVar11 = (uVar15 ^ 0xffffffe0) + 0x1f;
      uVar15 = (int)((ulong)uVar12 - 6 >> ((byte)iVar11 & 0x3f)) + iVar11 * 2 + 4;
    }
    else {
      uVar15 = 0x17;
      if (uVar12 < 0x846) {
        uVar15 = 0x1f;
        if (uVar12 - 0x46 != 0) {
          for (; uVar12 - 0x46 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        uVar15 = (uVar15 ^ 0xffffffe0) + 0x2c;
      }
    }
    uVar14 = (uVar14 & 0xffff) << 2;
    iVar11 = *(int *)(kBrotliInsExtra + uVar14);
    uVar15 = (uVar15 & 0xffff) << 2;
    iVar5 = *(int *)(kBrotliCopyExtra + uVar15);
    uVar13 = *storage_ix;
    *(ulong *)(storage + (uVar13 >> 3)) =
         ((ulong)(uVar12 - *(int *)(kBrotliCopyBase + uVar15)) << ((byte)iVar11 & 0x3f) |
         (ulong)(uVar7 - *(int *)(kBrotliInsBase + uVar14))) << ((byte)uVar13 & 7) |
         (ulong)storage[uVar13 >> 3];
    *storage_ix = (uint)(iVar11 + iVar5) + uVar13;
    if (mb->literal_context_map_size == 0) {
      while (bVar20 = uVar8 != 0, uVar8 = uVar8 - 1, bVar20) {
        StoreSymbol(self_00,(ulong)input[start_pos & mask],storage_ix,storage);
        start_pos = start_pos + 1;
      }
    }
    else {
      while (bVar20 = uVar8 != 0, uVar8 = uVar8 - 1, bVar20) {
        bVar1 = input[start_pos & mask];
        StoreSymbolWithContext
                  (self_00,(ulong)bVar1,
                   (ulong)(byte)((&UNK_010d7520)
                                 [(ulong)prev_byte2 + (long)(int)(literal_context_mode << 9)] |
                                (&_kBrotliContextLookupTable)
                                [(ulong)prev_byte + (long)(int)(literal_context_mode << 9)]),
                   mb->literal_context_map,storage_ix,storage,6);
        start_pos = start_pos + 1;
        prev_byte2 = prev_byte;
        prev_byte = bVar1;
      }
    }
    start_pos = start_pos + uVar18;
    if (uVar18 != 0) {
      prev_byte2 = input[start_pos - 2 & mask];
      prev_byte = input[start_pos - 1 & mask];
      if (0x7f < uVar2) {
        uVar8 = (ulong)(uVar3 & 0x3ff);
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(self,uVar8,storage_ix,storage);
        }
        else {
          sVar19 = (size_t)(uVar2 & 7);
          if (2 < (uVar2 & 7)) {
            sVar19 = 3;
          }
          context = 3;
          if (((uVar2 >> 6) - 2 & 0xfffffffd) == 0) {
            context = sVar19;
          }
          if (uVar2 >> 6 == 7) {
            context = sVar19;
          }
          StoreSymbolWithContext(self,uVar8,context,mb->distance_context_map,storage_ix,storage,2);
        }
        uVar8 = *storage_ix;
        *(ulong *)(storage + (uVar8 >> 3)) =
             (ulong)uVar4 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
        *storage_ix = (uVar3 >> 10) + uVar8;
      }
    }
  }
  CleanupBlockEncoder(m,self);
  CleanupBlockEncoder(m,self_01);
  CleanupBlockEncoder(m,self_00);
  BrotliFree(m,self_00);
  if (is_last != 0) {
    uVar7 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar7 & 0xfffffff8);
    storage[uVar7 >> 3] = '\0';
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreMetaBlock(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    uint8_t prev_byte, uint8_t prev_byte2, BROTLI_BOOL is_last,
    const BrotliEncoderParams* params, ContextType literal_context_mode,
    const Command* commands, size_t n_commands, const MetaBlockSplit* mb,
    size_t* storage_ix, uint8_t* storage) {

  size_t pos = start_pos;
  size_t i;
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  uint32_t num_effective_distance_symbols = params->dist.alphabet_size_limit;
  HuffmanTree* tree;
  ContextLut literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);
  StoreMetablockArena* arena = NULL;
  BlockEncoder* literal_enc = NULL;
  BlockEncoder* command_enc = NULL;
  BlockEncoder* distance_enc = NULL;
  const BrotliDistanceParams* dist = &params->dist;
  BROTLI_DCHECK(
      num_effective_distance_symbols <= BROTLI_NUM_HISTOGRAM_DISTANCE_SYMBOLS);

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  arena = BROTLI_ALLOC(m, StoreMetablockArena, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(tree) || BROTLI_IS_NULL(arena)) return;
  literal_enc = &arena->literal_enc;
  command_enc = &arena->command_enc;
  distance_enc = &arena->distance_enc;
  InitBlockEncoder(literal_enc, BROTLI_NUM_LITERAL_SYMBOLS,
      mb->literal_split.num_types, mb->literal_split.types,
      mb->literal_split.lengths, mb->literal_split.num_blocks);
  InitBlockEncoder(command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(distance_enc, num_effective_distance_symbols,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, dist->distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(
      4, dist->num_direct_distance_codes >> dist->distance_postfix_bits,
      storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(
        &arena->context_map_arena, mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m, &arena->context_map_arena,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(
        &arena->context_map_arena, mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m, &arena->context_map_arena,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, BROTLI_NUM_LITERAL_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, command_enc, mb->command_histograms,
      mb->command_histograms_size, BROTLI_NUM_COMMAND_SYMBOLS, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, num_distance_symbols, tree,
      storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context =
            BROTLI_CONTEXT(prev_byte, prev_byte2, literal_context_lut);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_ & 0x3FF;
        uint32_t distnumextra = cmd.dist_prefix_ >> 10;
        uint64_t distextra = cmd.dist_extra_;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, distance_enc);
  CleanupBlockEncoder(m, command_enc);
  CleanupBlockEncoder(m, literal_enc);
  BROTLI_FREE(m, arena);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}